

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Statements(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
             *this,bool t_class_allowed)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  eval_error *peVar7;
  bool bVar8;
  bool bVar9;
  Depth_Counter dc;
  string local_68;
  uint local_44;
  Depth_Counter local_40;
  File_Position local_38;
  
  Depth_Counter::Depth_Counter(&local_40,this);
  bVar8 = true;
  local_44 = (uint)t_class_allowed;
  bVar4 = false;
  do {
    iVar1 = (this->m_position).line;
    iVar2 = (this->m_position).col;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68);
    bVar5 = Def(this,false,&local_68);
    local_38.line = iVar1;
    local_38.column = iVar2;
    if (bVar5) {
LAB_0049303d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
LAB_00493059:
      bVar9 = true;
      bVar5 = true;
      bVar3 = true;
      if (!bVar8) {
        peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Two function definitions missing line separator","");
        exception::eval_error::eval_error
                  (peVar7,&local_68,&local_38,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    else {
      bVar5 = Try(this);
      if (bVar5) goto LAB_0049303d;
      bVar5 = If(this);
      if (bVar5) goto LAB_0049303d;
      bVar5 = While(this);
      if (bVar5) goto LAB_0049303d;
      bVar5 = Class(this,SUB41(local_44,0));
      if (bVar5) goto LAB_0049303d;
      bVar5 = For(this);
      if (bVar5) goto LAB_0049303d;
      bVar5 = Switch(this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) goto LAB_00493059;
      bVar5 = Return(this);
      if (bVar5) {
LAB_004930dd:
        if (!bVar8) {
          peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Two expressions missing line separator","");
          exception::eval_error::eval_error
                    (peVar7,&local_68,&local_38,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        bVar9 = true;
        bVar5 = true;
        bVar3 = false;
      }
      else {
        bVar5 = Break(this);
        if (bVar5) goto LAB_004930dd;
        bVar5 = Continue(this);
        if (bVar5) goto LAB_004930dd;
        bVar5 = Equation(this);
        if (bVar5) goto LAB_004930dd;
        bVar6 = Block(this);
        bVar9 = true;
        bVar5 = true;
        bVar3 = true;
        if (!bVar6) {
          bVar6 = Eol(this);
          bVar9 = true;
          bVar5 = true;
          bVar3 = true;
          if (!bVar6) {
            bVar9 = false;
            bVar5 = bVar4;
            bVar3 = bVar8;
          }
        }
      }
    }
    bVar8 = bVar3;
    bVar4 = bVar5;
    if (!bVar9) {
      (local_40.parser)->m_current_parse_depth = (local_40.parser)->m_current_parse_depth - 1;
      return bVar5;
    }
  } while( true );
}

Assistant:

bool Statements(const bool t_class_allowed = false) {
        Depth_Counter dc{this};
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def() || Try() || If() || While() || Class(t_class_allowed) || For() || Switch()) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator",
                                          File_Position(start.line, start.col),
                                          *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Return() || Break() || Continue() || Equation()) {
            if (!saw_eol) {
              throw exception::eval_error("Two expressions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = false;
          } else if (Block() || Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }